

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscContext.h
# Opt level: O0

void __thiscall CNscContext::AddStream(CNscContext *this,CNwnStream *pStream)

{
  long lVar1;
  string *this_00;
  int iVar2;
  Entry *pEVar3;
  char *pcVar4;
  undefined4 extraout_var;
  size_type sVar5;
  char *__s;
  size_t sVar6;
  char *__dest;
  vector<CNscContext::File,_std::allocator<CNscContext::File>_> *this_01;
  undefined8 uStack_c0;
  char acStack_b8 [8];
  string *local_b0;
  CNscContext *local_a8 [3];
  string local_90 [8];
  File sFile;
  char *pszExt;
  char *pszCopy;
  size_t nLength;
  char *pszBaseName;
  char *pszFileName;
  Entry *pEntry;
  CNwnStream *pStream_local;
  CNscContext *this_local;
  
  uStack_c0 = 0x1daa48;
  local_a8[0] = this;
  pEVar3 = (Entry *)operator_new(0x38);
  pEVar3->pNext = local_a8[0]->m_pStreamTop;
  pEVar3->pStream = pStream;
  uStack_c0 = 0x1daa77;
  pcVar4 = (char *)operator_new__(0x9000);
  pEVar3->pszLine = pcVar4;
  pEVar3->pszToken = pEVar3->pszLine + 0x8000;
  pEVar3->pszNextTokenPos = (char *)0x0;
  pEVar3->pszNextUnreplacedTokenPos = (char *)0x0;
  pEVar3->nLine = 0;
  pEVar3->nFile = -1;
  local_a8[0]->m_pStreamTop = pEVar3;
  local_a8[0]->m_nStreamDepth = local_a8[0]->m_nStreamDepth + 1;
  uStack_c0 = 0x1daae9;
  iVar2 = (*pStream->_vptr_CNwnStream[0xd])();
  pcVar4 = (char *)CONCAT44(extraout_var,iVar2);
  if (pcVar4 != (char *)0x0) {
    uStack_c0 = 0x1dab0b;
    sVar5 = std::vector<CNscContext::File,_std::allocator<CNscContext::File>_>::size
                      (&local_a8[0]->m_asFiles);
    pEVar3->nFile = (int)sVar5;
    uStack_c0 = 0x1dab1d;
    __s = NwnBasename(pcVar4);
    uStack_c0 = 0x1dab2a;
    sVar6 = strlen(__s);
    lVar1 = -(sVar6 + 0x10 & 0xfffffffffffffff0);
    __dest = acStack_b8 + lVar1;
    *(undefined8 *)((long)&uStack_c0 + lVar1) = 0x1dab54;
    strcpy(__dest,__s);
    *(undefined8 *)((long)&uStack_c0 + lVar1) = 0x1dab62;
    sFile._64_8_ = strrchr(__dest,0x2e);
    if ((char *)sFile._64_8_ != (char *)0x0) {
      *(char *)sFile._64_8_ = '\0';
    }
    this_01 = &local_a8[0]->m_asFiles;
    *(undefined8 *)((long)&uStack_c0 + lVar1) = 0x1dab87;
    sVar5 = std::vector<CNscContext::File,_std::allocator<CNscContext::File>_>::size(this_01);
    if (sVar5 == 0) {
      *(undefined8 *)((long)&uStack_c0 + lVar1) = 0x1dab96;
      strlwr(*(char **)((long)&local_b0 + lVar1));
    }
    local_b0 = local_90;
    *(undefined8 *)((long)&uStack_c0 + lVar1) = 0x1daba9;
    File::File(*(File **)((long)&local_b0 + lVar1));
    this_00 = local_b0;
    *(undefined8 *)((long)&uStack_c0 + lVar1) = 0x1dabb9;
    std::__cxx11::string::operator=(this_00,__dest);
    *(undefined8 *)((long)&uStack_c0 + lVar1) = 0x1dabc8;
    std::__cxx11::string::operator=((string *)&sFile.field_0x18,pcVar4);
    sFile._56_4_ = 0xffffffff;
    sFile._60_4_ = 0xffffffff;
    *(undefined8 *)((long)&uStack_c0 + lVar1) = 0x1dabf2;
    std::vector<CNscContext::File,_std::allocator<CNscContext::File>_>::push_back
              (*(vector<CNscContext::File,_std::allocator<CNscContext::File>_> **)
                ((long)local_a8 + lVar1 + 8),*(value_type **)((long)local_a8 + lVar1));
    *(undefined8 *)((long)&uStack_c0 + lVar1) = 0x1dac00;
    File::~File(*(File **)((long)&local_b0 + lVar1));
  }
  return;
}

Assistant:

void AddStream (CNwnStream *pStream)
	{

		//
		// Add a new entry to the list
		//

		Entry *pEntry = new Entry;
		pEntry ->pNext = m_pStreamTop;
		pEntry ->pStream = pStream;
		pEntry ->pszLine = new char [Max_Line_Length + Max_Token_Length];
		pEntry ->pszToken = &pEntry ->pszLine [Max_Line_Length];
		pEntry ->pszNextTokenPos = NULL;
		pEntry ->pszNextUnreplacedTokenPos = NULL;
		pEntry ->nLine = 0;
		pEntry ->nFile = -1;
		m_pStreamTop = pEntry;
		m_nStreamDepth++;

		//
		// Add the file name to the list of files
		//

		const char *pszFileName = pStream ->GetFileName ();
		if (pszFileName)
		{
			pEntry ->nFile = (int) m_asFiles .size ();
			const char *pszBaseName = NwnBasename (pszFileName);
			size_t nLength = strlen (pszBaseName);
			char *pszCopy = (char *) alloca (nLength + 1);
			strcpy (pszCopy, pszBaseName);
			char *pszExt = strrchr (pszCopy, '.');
			if (pszExt)
				*pszExt = 0;
			// In the NDB file, the main is lowercase...
			if (m_asFiles .size () == 0)
				strlwr (pszCopy);
			File sFile;
			sFile .strName = pszCopy;
			sFile .strFullName = pszFileName;
			sFile .nOutputIndex = -1;
			sFile .nFileIndex = -1;
			m_asFiles .push_back (sFile);
		}
		return;
	}